

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O3

int64_t pick_interinter_wedge
                  (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,uint8_t *p1,
                  int16_t *residual1,int16_t *diff10,uint64_t *best_sse)

{
  byte bVar1;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  AV1_COMP *pAVar5;
  int8_t iVar6;
  undefined3 extraout_var;
  int iVar7;
  int64_t iVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  byte bVar11;
  undefined7 in_register_00000011;
  long lVar12;
  uint cols;
  char cVar13;
  long lVar14;
  long lVar15;
  uint8_t *puVar16;
  ulong uVar17;
  uint32_t n;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dist_by_sse_norm_f;
  double rate_f;
  uint32_t esq [2] [2];
  uint64_t *best_sse_00;
  char local_80ea;
  int8_t local_80e9;
  uint local_80e8;
  undefined4 local_80e4;
  uint8_t *local_80e0;
  AV1_COMP *local_80d8;
  AV1_COMP *local_80d0;
  double local_80c8;
  double local_80c0;
  undefined8 local_80b8;
  uint8_t *local_80b0;
  uint8_t *local_80a8;
  ulong local_80a0;
  int16_t *local_8098;
  MB_MODE_INFO *local_8090;
  long local_8088;
  long local_8080;
  long local_8078;
  double local_8070;
  double local_8068;
  uint local_8060;
  uint local_805c;
  uint local_8058;
  uint local_8054 [8201];
  
  local_8090 = *(x->e_mbd).mi;
  local_80e8 = (uint)CONCAT71(in_register_00000011,bsize);
  local_80a0 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  bVar11 = block_size_wide[local_80a0];
  uVar17 = (ulong)bVar11;
  local_80e9 = -1;
  local_80d0 = (AV1_COMP *)x;
  local_8098 = residual1;
  if ((cpi->sf).inter_sf.fast_wedge_sign_estimate == 0) {
    bVar1 = block_size_high[local_80a0];
    cols = (uint)bVar11;
    n = bVar1 * cols;
    uVar3 = *(undefined4 *)
             ((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(local_80e8 << 5));
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      (*aom_subtract_block)
                ((int)bVar1,cols,(int16_t *)&local_8060,uVar17,x->plane[0].src.buf,
                 (long)x->plane[0].src.stride,p0,uVar17);
      local_80b8 = (ulong)local_80b8._4_4_ << 0x20;
    }
    else {
      local_80b8 = CONCAT44(local_80b8._4_4_,(x->e_mbd).bd * 2 + -0x10);
      aom_highbd_subtract_block_sse2
                ((uint)bVar1,cols,(int16_t *)&local_8060,(ulong)cols,x->plane[0].src.buf,
                 (long)x->plane[0].src.stride,(uint8_t *)((ulong)p0 >> 1),(ulong)cols);
    }
    local_80e0 = (uint8_t *)0x7fffffffffffffff;
    uVar9 = aom_sum_squares_i16_sse2((int16_t *)&local_8060,n);
    uVar10 = aom_sum_squares_i16_sse2(residual1,n);
    (*av1_wedge_compute_delta_squares)((int16_t *)&local_8060,(int16_t *)&local_8060,residual1,n);
    pAVar5 = local_80d0;
    cVar13 = (char)uVar3;
    local_80a8 = (uint8_t *)CONCAT44(local_80a8._4_4_,(int)cVar13);
    if (cVar13 < '\x01') {
      lVar14 = (long)*(int *)((long)local_80d0 + 0x4218);
      local_80ea = -1;
      local_80e4 = 0;
    }
    else {
      local_80d8 = (AV1_COMP *)((uVar9 - uVar10) * 0x20);
      local_8078 = *(long *)((long)&av1_wedge_params_lookup[0].masks +
                            (ulong)(uint)((int)local_80a0 << 5));
      local_8080 = (long)((1 << ((byte)local_80b8 & 0x1f)) >> 1);
      local_80c0 = (double)n;
      local_80b8 = local_80b8 & 0xffffffff;
      local_80ea = -1;
      local_8088 = (long)((ModeCosts *)((long)local_80d0 + 0x4230))->wedge_idx_cost[0] +
                   (ulong)(uint)((int)local_80a0 << 6);
      local_80e8 = local_80e8 & 0xff;
      local_80e4 = 0;
      cVar13 = '\0';
      local_80b0 = (uint8_t *)CONCAT44(local_80b0._4_4_,n);
      do {
        lVar15 = (long)cVar13;
        lVar14 = local_8078 + lVar15 * 8;
        iVar6 = (*av1_wedge_sign_from_residuals)
                          ((int16_t *)&local_8060,*(uint8_t **)(local_8078 + lVar15 * 8),n,
                           (int64_t)local_80d8);
        uVar9 = (*av1_wedge_sse_from_residuals)
                          (local_8098,diff10,*(uint8_t **)((long)iVar6 * 0x80 + lVar14),n);
        uVar17 = uVar9 + local_8080 >> ((byte)local_80b8 & 0x3f);
        bVar11 = 3;
        if ((((MACROBLOCKD *)((long)pAVar5 + 0x1a0))->cur_buf->flags & 8) != 0) {
          bVar11 = (char)((MACROBLOCKD *)((long)pAVar5 + 0x1a0))->bd - 5;
        }
        if (uVar17 == 0) {
          iVar7 = 0;
          lVar12 = 0;
        }
        else {
          iVar7 = (int)((macroblock_plane *)&pAVar5->ppi)->dequant_QTX[1] >> (bVar11 & 0x1f);
          if (iVar7 < 2) {
            iVar7 = 1;
          }
          local_80c8 = (double)(long)uVar17 / local_80c0;
          dVar19 = log2(local_80c8 / ((double)iVar7 * (double)iVar7));
          av1_model_rd_curvfit((BLOCK_SIZE)local_80e8,local_80c8,dVar19,&local_8068,&local_8070);
          dVar19 = 0.0;
          if (0.0 <= local_8068 * local_80c0) {
            dVar19 = local_8068 * local_80c0;
          }
          iVar7 = (int)(dVar19 + 0.5);
          if (iVar7 == 0) {
            iVar7 = 0;
            lVar12 = uVar17 << 4;
          }
          else {
            dVar20 = local_80c8 * local_8070 * local_80c0;
            dVar19 = 0.0;
            if (0.0 <= dVar20) {
              dVar19 = dVar20;
            }
            lVar12 = (long)(dVar19 + 0.5);
            if ((long)(uVar17 * 0x800) <=
                lVar12 * 0x80 + ((long)*(int *)((long)pAVar5 + 0x4218) * (long)iVar7 + 0x100 >> 9))
            {
              iVar7 = 0;
              lVar12 = uVar17 << 4;
            }
          }
          lVar12 = lVar12 << 7;
        }
        lVar14 = (long)*(int *)((long)pAVar5 + 0x4218);
        lVar12 = (((long)iVar7 + (long)*(int *)(local_8088 + lVar15 * 4)) * lVar14 + 0x100 >> 9) +
                 lVar12;
        if (lVar12 < (long)local_80e0) {
          *best_sse = uVar17;
          local_80e0 = (uint8_t *)lVar12;
          local_80ea = cVar13;
          local_80e4 = CONCAT31(extraout_var,iVar6);
        }
        cVar13 = cVar13 + '\x01';
        n = (uint32_t)local_80b0;
      } while (cVar13 < (int)local_80a8);
    }
    iVar8 = (long)local_80e0 -
            (*(int *)((long)((ModeCosts *)((long)local_80d0 + 0x4230))->wedge_idx_cost[0] +
                     (long)local_80ea * 4 + (ulong)(uint)((int)local_80a0 << 6)) * lVar14 + 0x100 >>
            9);
    iVar6 = (int8_t)local_80e4;
    local_80e9 = local_80ea;
  }
  else {
    local_80e0 = x->plane[0].src.buf;
    iVar7 = x->plane[0].src.stride;
    local_80c0 = (double)CONCAT44(local_80c0._4_4_,iVar7);
    bVar18 = (((x->e_mbd).cur_buf)->flags & 8) == 0;
    bVar1 = block_size_high[local_80a0];
    local_80a8 = (uint8_t *)((ulong)p1 >> 1);
    if (bVar18) {
      local_80a8 = p1;
    }
    bVar2 = estimate_wedge_sign_split_qtr[local_80a0];
    puVar16 = (uint8_t *)((ulong)p0 >> 1);
    if (bVar18) {
      puVar16 = p0;
    }
    local_80d8 = cpi;
    local_80c8 = (double)uVar17;
    (*cpi->ppi->fn_ptr[bVar2].vf)(local_80e0,iVar7,puVar16,(int)bVar11,&local_8060);
    pAVar5 = local_80d8;
    local_80b0 = local_80e0 + (long)(int)(iVar7 * (uint)(bVar1 >> 1)) + (ulong)(bVar11 >> 1);
    lVar14 = (ulong)((uint)(bVar1 >> 1) * SUB84(local_80c8,0)) + (ulong)(bVar11 >> 1);
    (*local_80d8->ppi->fn_ptr[bVar2].vf)
              (local_80b0,iVar7,puVar16 + lVar14,SUB84(local_80c8,0),&local_805c);
    puVar16 = local_80a8;
    iVar4 = SUB84(local_80c8,0);
    (*pAVar5->ppi->fn_ptr[bVar2].vf)(local_80e0,iVar7,local_80a8,iVar4,&local_8058);
    best_sse_00 = (uint64_t *)0x3b83a7;
    (*pAVar5->ppi->fn_ptr[bVar2].vf)
              (local_80b0,SUB84(local_80c0,0),puVar16 + lVar14,iVar4,local_8054);
    iVar6 = (ulong)local_805c + (ulong)local_8058 < (ulong)local_8054[0] + (ulong)local_8060;
    iVar8 = pick_wedge_fixed_sign
                      (local_80d0,(MACROBLOCK *)(ulong)(byte)local_80e8,(BLOCK_SIZE)local_8098,
                       diff10,(int16_t *)(ulong)(byte)iVar6,(int8_t)&local_80e9,(int8_t *)best_sse,
                       best_sse_00);
  }
  (local_8090->interinter_comp).wedge_sign = iVar6;
  (local_8090->interinter_comp).wedge_index = local_80e9;
  return iVar8;
}

Assistant:

static int64_t pick_interinter_wedge(
    const AV1_COMP *const cpi, MACROBLOCK *const x, const BLOCK_SIZE bsize,
    const uint8_t *const p0, const uint8_t *const p1,
    const int16_t *const residual1, const int16_t *const diff10,
    uint64_t *best_sse) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int bw = block_size_wide[bsize];

  int64_t rd;
  int8_t wedge_index = -1;
  int8_t wedge_sign = 0;

  assert(is_interinter_compound_used(COMPOUND_WEDGE, bsize));
  assert(cpi->common.seq_params->enable_masked_compound);

  if (cpi->sf.inter_sf.fast_wedge_sign_estimate) {
    wedge_sign = estimate_wedge_sign(cpi, x, bsize, p0, bw, p1, bw);
    rd = pick_wedge_fixed_sign(cpi, x, bsize, residual1, diff10, wedge_sign,
                               &wedge_index, best_sse);
  } else {
    rd = pick_wedge(cpi, x, bsize, p0, residual1, diff10, &wedge_sign,
                    &wedge_index, best_sse);
  }

  mbmi->interinter_comp.wedge_sign = wedge_sign;
  mbmi->interinter_comp.wedge_index = wedge_index;
  return rd;
}